

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codepage.cpp
# Opt level: O2

string * booster::locale::conv::impl::convert_from<wchar_t>
                   (string *__return_storage_ptr__,wchar_t *begin,wchar_t *end,char *charset,
                   method_type how)

{
  int iVar1;
  iconv_from_utf<wchar_t> *this;
  iconv_from_utf<wchar_t> *piVar2;
  invalid_charset_error *this_00;
  pointer __old_p;
  allocator local_59;
  wchar_t *local_58;
  string local_50;
  
  local_58 = end;
  this = (iconv_from_utf<wchar_t> *)operator_new(0x18);
  *(undefined8 *)&(this->self_).how_ = 0;
  (this->super_converter_from_utf<wchar_t>)._vptr_converter_from_utf =
       (_func_int **)&PTR_open_001d9718;
  (this->self_).cvt_ = (iconv_t)0xffffffffffffffff;
  iVar1 = iconv_from_utf<wchar_t>::open(this,charset,how);
  if ((char)iVar1 == '\0') {
    piVar2 = (iconv_from_utf<wchar_t> *)operator_new(0x18);
    (piVar2->super_converter_from_utf<wchar_t>)._vptr_converter_from_utf =
         (_func_int **)&PTR_open_001d9770;
    (piVar2->self_).cvt_ = (iconv_t)0x0;
    *(undefined8 *)&(piVar2->self_).how_ = 0;
    (*(this->super_converter_from_utf<wchar_t>)._vptr_converter_from_utf[3])(this);
    iVar1 = (**(piVar2->super_converter_from_utf<wchar_t>)._vptr_converter_from_utf)
                      (piVar2,charset,(ulong)how);
    if ((char)iVar1 == '\0') {
      this_00 = (invalid_charset_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_50,charset,&local_59);
      invalid_charset_error::invalid_charset_error(this_00,&local_50);
      __cxa_throw(this_00,&invalid_charset_error::typeinfo,runtime_error::~runtime_error);
    }
    (*(piVar2->super_converter_from_utf<wchar_t>)._vptr_converter_from_utf[1])
              (__return_storage_ptr__,piVar2,begin,local_58);
  }
  else {
    (*(this->super_converter_from_utf<wchar_t>)._vptr_converter_from_utf[1])
              (__return_storage_ptr__,this,begin,local_58);
    piVar2 = this;
  }
  (*(piVar2->super_converter_from_utf<wchar_t>)._vptr_converter_from_utf[3])(piVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string convert_from(
                                        CharType const *begin,
                                        CharType const *end,
                                        char const *charset,
                                        method_type how)
                {
                    std::unique_ptr<converter_from_utf<CharType> > cvt;
                    #ifdef BOOSTER_LOCALE_WITH_ICONV
                    cvt.reset(new iconv_from_utf<CharType>());
                    if(cvt->open(charset,how))
                        return cvt->convert(begin,end);
                    #endif
                    #ifdef BOOSTER_LOCALE_WITH_ICU
                    cvt.reset(new uconv_from_utf<CharType>());
                    if(cvt->open(charset,how))
                        return cvt->convert(begin,end);
                    #endif
                    #ifdef BOOSTER_LOCALE_WITH_WCONV
                    cvt.reset(new wconv_from_utf<CharType>());
                    if(cvt->open(charset,how))
                        return cvt->convert(begin,end);
                    #endif
                    throw invalid_charset_error(charset);
                }